

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_protocol.cpp
# Opt level: O0

bool __thiscall
udpdiscovery::Packet::Serialize
          (Packet *this,ProtocolVersion protocol_version,SerializeDirection direction,
          BufferView *buffer_view)

{
  bool bVar1;
  PacketType PVar2;
  int iVar3;
  unsigned_short local_34;
  ushort local_32;
  int local_30;
  uint16_t padding_size;
  uint16_t user_data_size;
  int i;
  uint8_t reserved;
  uint8_t version;
  BufferView *buffer_view_local;
  SerializeDirection direction_local;
  ProtocolVersion protocol_version_local;
  Packet *this_local;
  
  _i = buffer_view;
  buffer_view_local._0_4_ = direction;
  buffer_view_local._4_4_ = protocol_version;
  _direction_local = this;
  if (direction == kSerialize) {
    if (protocol_version == kProtocolVersion0) {
      impl::BufferView::push_back(buffer_view,'R');
      impl::BufferView::push_back(_i,'N');
      impl::BufferView::push_back(_i,'6');
      impl::BufferView::push_back(_i,'U');
    }
    else {
      if (protocol_version != kProtocolVersion1) {
        return false;
      }
      impl::BufferView::push_back(buffer_view,'S');
      impl::BufferView::push_back(_i,'O');
      impl::BufferView::push_back(_i,'7');
      impl::BufferView::push_back(_i,'V');
    }
    user_data_size._1_1_ = (undefined1)buffer_view_local._4_4_;
    impl::SerializeUnsignedIntegerBigEndian<unsigned_char>
              (kSerialize,(uchar *)((long)&user_data_size + 1),_i);
  }
  user_data_size._0_1_ = 0;
  for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
    bVar1 = impl::SerializeUnsignedIntegerBigEndian<unsigned_char>
                      ((SerializeDirection)buffer_view_local,(uchar *)&user_data_size,_i);
    if (!bVar1) {
      return false;
    }
  }
  bVar1 = impl::SerializeUnsignedIntegerBigEndian<unsigned_char>
                    ((SerializeDirection)buffer_view_local,&this->packet_type_,_i);
  if (bVar1) {
    if (((SerializeDirection)buffer_view_local == kParse) &&
       (PVar2 = impl::GetPacketType(this->packet_type_), PVar2 == kPacketTypeUnknown)) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = impl::SerializeUnsignedIntegerBigEndian<unsigned_int>
                        ((SerializeDirection)buffer_view_local,&this->application_id_,_i);
      if (bVar1) {
        bVar1 = impl::SerializeUnsignedIntegerBigEndian<unsigned_int>
                          ((SerializeDirection)buffer_view_local,&this->peer_id_,_i);
        if (bVar1) {
          bVar1 = impl::SerializeUnsignedIntegerBigEndian<unsigned_long>
                            ((SerializeDirection)buffer_view_local,&this->snapshot_index_,_i);
          if (bVar1) {
            local_32 = std::__cxx11::string::size();
            bVar1 = impl::SerializeUnsignedIntegerBigEndian<unsigned_short>
                              ((SerializeDirection)buffer_view_local,&local_32,_i);
            if (bVar1) {
              if ((SerializeDirection)buffer_view_local == kParse) {
                if (buffer_view_local._4_4_ == kProtocolVersion0) {
                  if (0x8000 < local_32) {
                    return false;
                  }
                }
                else if ((buffer_view_local._4_4_ == kProtocolVersion1) && (0x1000 < local_32)) {
                  return false;
                }
              }
              local_34 = 0;
              if (buffer_view_local._4_4_ == kProtocolVersion0) {
                bVar1 = impl::SerializeUnsignedIntegerBigEndian<unsigned_short>
                                  ((SerializeDirection)buffer_view_local,&local_34,_i);
                if (!bVar1) {
                  return false;
                }
                if (0x8000 < local_34) {
                  return false;
                }
              }
              if (((SerializeDirection)buffer_view_local == kParse) &&
                 (iVar3 = impl::BufferView::LeftUnparsed(_i),
                 iVar3 != (uint)local_32 + (uint)local_34)) {
                this_local._7_1_ = false;
              }
              else {
                bVar1 = impl::SerializeString
                                  ((SerializeDirection)buffer_view_local,&this->user_data_,
                                   (uint)local_32,_i);
                if (bVar1) {
                  this_local._7_1_ = true;
                }
                else {
                  this_local._7_1_ = false;
                }
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Packet::Serialize(ProtocolVersion protocol_version,
                       impl::SerializeDirection direction,
                       impl::BufferView* buffer_view) {
  if (direction == impl::kSerialize) {
    if (protocol_version == kProtocolVersion0) {
      buffer_view->push_back('R');
      buffer_view->push_back('N');
      buffer_view->push_back('6');
      buffer_view->push_back('U');
    } else if (protocol_version == kProtocolVersion1) {
      buffer_view->push_back('S');
      buffer_view->push_back('O');
      buffer_view->push_back('7');
      buffer_view->push_back('V');
    } else {
      return false;
    }

    uint8_t version = protocol_version;
    impl::SerializeUnsignedIntegerBigEndian(impl::kSerialize, &version,
                                            buffer_view);
  }

  uint8_t reserved = 0;
  for (int i = 0; i < 3; ++i) {
    if (!impl::SerializeUnsignedIntegerBigEndian(direction, &reserved,
                                                 buffer_view)) {
      return false;
    }
  }

  if (!impl::SerializeUnsignedIntegerBigEndian(direction, &packet_type_,
                                               buffer_view)) {
    return false;
  }

  if (direction == impl::kParse) {
    if (impl::GetPacketType(packet_type_) == kPacketTypeUnknown) {
      return false;
    }
  }

  if (!impl::SerializeUnsignedIntegerBigEndian(direction, &application_id_,
                                               buffer_view)) {
    return false;
  }

  if (!impl::SerializeUnsignedIntegerBigEndian(direction, &peer_id_,
                                               buffer_view)) {
    return false;
  }

  if (!impl::SerializeUnsignedIntegerBigEndian(direction, &snapshot_index_,
                                               buffer_view)) {
    return false;
  }

  uint16_t user_data_size = (uint16_t)user_data_.size();
  if (!impl::SerializeUnsignedIntegerBigEndian(direction, &user_data_size,
                                               buffer_view)) {
    return false;
  }

  if (direction == impl::kParse) {
    if (protocol_version == kProtocolVersion0) {
      if (user_data_size > kMaxUserDataSizeV0) {
        return false;
      }
    } else if (protocol_version == kProtocolVersion1) {
      if (user_data_size > kMaxUserDataSizeV1) {
        return false;
      }
    }
  }

  uint16_t padding_size = 0;
  if (protocol_version == kProtocolVersion0) {
    if (!impl::SerializeUnsignedIntegerBigEndian(direction, &padding_size,
                                                 buffer_view)) {
      return false;
    }

    if (padding_size > kMaxPaddingSizeV0) {
      return false;
    }
  }

  // End of serializing header.

  if (direction == impl::kParse) {
    if (buffer_view->LeftUnparsed() != user_data_size + padding_size) {
      return false;
    }
  }

  if (!impl::SerializeString(direction, &user_data_, user_data_size,
                             buffer_view)) {
    return false;
  }

  // Do not serialize padding even for protocol version 0.

  return true;
}